

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O0

void ncnn::crop_pack8_avx(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  __m256 _p;
  int x;
  int y;
  float *outptr;
  float *ptr;
  int right;
  int h;
  int w;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined8 *local_b0;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  iVar2 = *(int *)(in_RSI + 6);
  iVar3 = *(int *)((long)in_RDI + 0x2c);
  iVar4 = *(int *)((long)in_RSI + 0x2c);
  local_b0 = (undefined8 *)
             (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_EDX * in_RDI[2] +
             (long)(in_ECX << 3) * 4);
  local_b8 = (undefined8 *)*in_RSI;
  for (local_bc = 0; local_bc < iVar2; local_bc = local_bc + 1) {
    for (local_c0 = 0; local_c0 < iVar1; local_c0 = local_c0 + 1) {
      uVar5 = local_b0[1];
      uVar6 = local_b0[2];
      uVar7 = local_b0[3];
      *local_b8 = *local_b0;
      local_b8[1] = uVar5;
      local_b8[2] = uVar6;
      local_b8[3] = uVar7;
      local_b0 = local_b0 + 4;
      local_b8 = local_b8 + 4;
    }
    local_b0 = (undefined8 *)((long)local_b0 + (long)((iVar3 - iVar4) * 8) * 4);
  }
  return;
}

Assistant:

static void crop_pack8_avx(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 8;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }

        ptr += (left + right) * 8;
    }
}